

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkSaveCopy(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  ulong uVar7;
  
  pVVar2 = pNtk->vObjs;
  uVar1 = pVVar2->nSize;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar1 - 1) {
    uVar5 = uVar1;
  }
  pVVar6->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar5 << 3);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 * 8);
  if (0 < (int)uVar1) {
    ppvVar3 = pVVar2->pArray;
    uVar7 = 0;
    do {
      pvVar4 = ppvVar3[uVar7];
      if (pvVar4 != (void *)0x0) {
        if ((long)(int)uVar1 <= (long)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[uVar7] = *(void **)((long)pvVar4 + 0x40);
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Abc_NtkSaveCopy( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vCopies;
    Abc_Obj_t * pObj;
    int i;
    vCopies = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( vCopies, i, pObj->pCopy );
    return vCopies;
}